

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# untyped_message.cc
# Opt level: O2

Status google::protobuf::json_internal::MakeInvalidLengthDelimType(int kind,int field_number)

{
  uintptr_t in_RDI;
  int local_48;
  int local_44;
  string local_40;
  FormatSpec<int,_int> local_20;
  
  local_20.super_type.spec_.data_ = "field type %d (number %d) does not support type 2 records";
  local_20.super_type.spec_.size_ = 0x39;
  absl::lts_20240722::StrFormat<int,_int>(&local_40,&local_20,&local_44,&local_48);
  absl::lts_20240722::InvalidArgumentError();
  std::__cxx11::string::~string((string *)&local_40);
  return (Status)in_RDI;
}

Assistant:

PROTOBUF_NOINLINE static absl::Status MakeInvalidLengthDelimType(
    int kind, int field_number) {
  return absl::InvalidArgumentError(absl::StrFormat(
      "field type %d (number %d) does not support type 2 records", kind,
      field_number));
}